

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O0

void __thiscall FPatchTexture::~FPatchTexture(FPatchTexture *this)

{
  FPatchTexture *this_local;
  
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPatchTexture_00a08458;
  (*(this->super_FTexture)._vptr_FTexture[9])();
  if (this->Spans != (Span **)0x0) {
    FTexture::FreeSpans(&this->super_FTexture,this->Spans);
    this->Spans = (Span **)0x0;
  }
  FTexture::~FTexture(&this->super_FTexture);
  return;
}

Assistant:

FPatchTexture::~FPatchTexture ()
{
	Unload ();
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
}